

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68020_cptrapcc_0(m68k_info *info)

{
  uint size;
  long in_RDI;
  m68k_info *unaff_retaddr;
  uint extension1;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if ((*(uint *)(in_RDI + 0x28) & 0x1c) == 0) {
    d68000_invalid((m68k_info *)0x385483);
  }
  else {
    size = read_imm_16((m68k_info *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    build_init_op(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,size);
    *(uint *)(*(long *)(in_RDI + 0x18) + 8) = (size & 0x2f) + *(int *)(*(long *)(in_RDI + 0x18) + 8)
    ;
  }
  return;
}

Assistant:

static void d68020_cptrapcc_0(m68k_info *info)
{
	uint extension1;
	LIMIT_CPU_TYPES(info, M68020_PLUS);

	extension1 = read_imm_16(info);

	build_init_op(info, M68K_INS_FTRAPF, 0, 0);

	// these are all in row with the extension so just doing a add here is fine
	info->inst->Opcode += (extension1 & 0x2f);
}